

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<float>_>::Phase
          (Phase<std::complex<float>_> *this,int qubit,angle_type *angle,bool fixed)

{
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  (this->super_QGate1<std::complex<float>_>).field_0xc = fixed;
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00122298;
  this->angle_ = *angle;
  return;
}

Assistant:

Phase( const int qubit , const angle_type& angle ,
               const bool fixed = false )
        : QGate1< T >( qubit )
        , angle_( angle )
        , QAdjustable( fixed )
        { }